

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

double duckdb::ApproxQuantileCoding::Encode<long,double>(long *input)

{
  double dVar1;
  
  dVar1 = Cast::Operation<long,double>(*input);
  return dVar1;
}

Assistant:

static SAVE_TYPE Encode(const INPUT_TYPE &input) {
		return Cast::template Operation<INPUT_TYPE, SAVE_TYPE>(input);
	}